

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBuiltinFunctions.hpp
# Opt level: O1

void __thiscall
rsg::
UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::LogOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::LogOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::LogOp>_>
::UnaryBuiltinVecFunc
          (UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::LogOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::LogOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::LogOp>_>
           *this,GeneratorState *state,char *function,ConstValueRangeAccess valueRange)

{
  pointer pSVar1;
  pointer pSVar2;
  int iVar3;
  pointer pSVar4;
  pointer pSVar5;
  long lVar6;
  float fVar7;
  float fVar8;
  allocator<char> local_59;
  UnaryBuiltinVecFunc<rsg::GetUnaryBuiltinVecWeight<rsg::LogOp>,_rsg::ComputeUnaryBuiltinVecRange<rsg::LogOp>,_rsg::EvaluateUnaryBuiltinVec<rsg::LogOp>_>
  *local_58;
  VariableType *local_50;
  ExecValueStorage *local_48;
  Scalar *local_40;
  Scalar *local_38;
  
  (this->super_Expression)._vptr_Expression = (_func_int **)&PTR__UnaryBuiltinVecFunc_021d21d0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_function,function,&local_59)
  ;
  local_50 = &(this->m_inValueRange).m_type;
  ValueRange::ValueRange((ValueRange *)local_50,valueRange.m_type);
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  this->m_child = (Expression *)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->m_value).m_value.super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_48 = &this->m_value;
  iVar3 = VariableType::getScalarSize(valueRange.m_type);
  std::vector<rsg::Scalar,_std::allocator<rsg::Scalar>_>::resize
            (&(this->m_value).m_value,(long)(iVar3 << 6));
  if (0 < (this->m_inValueRange).m_type.m_numElements) {
    local_38 = valueRange.m_min;
    local_40 = valueRange.m_max;
    lVar6 = 0;
    local_58 = this;
    do {
      VariableType::getElementType(valueRange.m_type);
      pSVar5 = (this->m_inValueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar1 = (this->m_inValueRange).m_min.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      pSVar4 = (this->m_inValueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_start;
      pSVar2 = (this->m_inValueRange).m_max.
               super__Vector_base<rsg::Scalar,_std::allocator<rsg::Scalar>_>._M_impl.
               super__Vector_impl_data._M_finish;
      VariableType::getElementType(local_50);
      if (pSVar4 == pSVar2) {
        pSVar4 = (pointer)0x0;
      }
      if (pSVar5 == pSVar1) {
        pSVar5 = (pointer)0x0;
      }
      fVar7 = local_38[lVar6].floatVal;
      if ((fVar7 <= 6.0) && (fVar8 = local_40[lVar6].floatVal, 0.1 <= fVar8)) {
        if (fVar7 <= 0.1) {
          fVar7 = 0.1;
        }
        fVar7 = expf(fVar7);
        pSVar5[lVar6].floatVal = fVar7;
        if (6.0 <= fVar8) {
          fVar8 = 6.0;
        }
        fVar7 = expf(fVar8);
        pSVar4[lVar6].floatVal = fVar7;
      }
      fVar7 = ceilf(pSVar5[lVar6].floatVal * 8.0);
      this = local_58;
      fVar7 = fVar7 * 0.125;
      if (fVar7 <= pSVar4[lVar6].floatVal) {
        pSVar5[lVar6].floatVal = fVar7;
        fVar8 = floorf(pSVar4[lVar6].floatVal * 8.0);
        if (fVar7 <= fVar8 * 0.125) {
          pSVar4[lVar6].floatVal = fVar8 * 0.125;
        }
      }
      lVar6 = lVar6 + 1;
    } while (lVar6 < (this->m_inValueRange).m_type.m_numElements);
  }
  return;
}

Assistant:

UnaryBuiltinVecFunc<GetValueRangeWeight, ComputeValueRange, Evaluate>::UnaryBuiltinVecFunc (GeneratorState& state, const char* function, ConstValueRangeAccess valueRange)
	: m_function		(function)
	, m_inValueRange	(valueRange.getType())
	, m_child			(DE_NULL)
{
	DE_UNREF(state);
	DE_ASSERT(valueRange.getType().isFloatOrVec());

	m_value.setStorage(valueRange.getType());

	// Compute input value range
	for (int ndx = 0; ndx < m_inValueRange.getType().getNumElements(); ndx++)
	{
		ConstValueRangeAccess	outRange	= valueRange.component(ndx);
		ValueRangeAccess		inRange		= m_inValueRange.asAccess().component(ndx);

		ComputeValueRange()(outRange.getMin().asFloat(), outRange.getMax().asFloat(), inRange.getMin().asFloat(), inRange.getMax().asFloat());
	}
}